

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_log.c
# Opt level: O1

void srunner_register_lfun(SRunner *sr,FILE *lfile,int close,LFun lfun,print_output printmode)

{
  undefined8 *val;
  
  val = (undefined8 *)emalloc(0x18);
  if (printmode == CK_ENV) {
    printmode = get_env_printmode();
  }
  *val = lfile;
  val[1] = lfun;
  *(int *)(val + 2) = close;
  *(print_output *)((long)val + 0x14) = printmode;
  check_list_add_end(sr->loglst,val);
  return;
}

Assistant:

void srunner_register_lfun(SRunner * sr, FILE * lfile, int close,
                           LFun lfun, enum print_output printmode)
{
    Log *l = (Log *)emalloc(sizeof(Log));

    if(printmode == CK_ENV)
    {
        printmode = get_env_printmode();
    }

    l->lfile = lfile;
    l->lfun = lfun;
    l->close = close;
    l->mode = printmode;
    check_list_add_end(sr->loglst, l);
    return;
}